

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multilayer_metadata.cc
# Opt level: O0

bool libaom_examples::double_to_depth_representation_element
               (double v,DepthRepresentationElement *element)

{
  undefined8 *in_RDI;
  double in_XMM0_Qa;
  int bit;
  uint8_t kMaxMantissaLen;
  uint8_t mantissa_len;
  uint32_t mantissa;
  int exp;
  bool sign;
  double orig;
  bool local_45;
  undefined1 uStack_41;
  byte local_35;
  int local_34;
  int local_30;
  byte bStack_25;
  double local_10;
  bool local_1;
  
  if ((in_XMM0_Qa != 0.0) || (NAN(in_XMM0_Qa))) {
    local_10 = in_XMM0_Qa;
    if (in_XMM0_Qa < 0.0) {
      local_10 = -in_XMM0_Qa;
    }
    local_30 = 0;
    if (local_10 < 1.0) {
      for (; local_10 < 1.0; local_10 = local_10 * 2.0) {
        local_30 = local_30 + 1;
      }
      local_30 = -local_30;
    }
    else {
      for (; 2.0 <= local_10; local_10 = local_10 / 2.0) {
        local_30 = local_30 + 1;
      }
    }
    if ((local_30 + 0x1f < 1) || (0x7e < local_30 + 0x1f)) {
      fprintf(_stderr,"Error: Floating point value %f out of range (too large or too small)\n",
              in_XMM0_Qa);
      local_1 = false;
    }
    else {
      local_10 = local_10 - 1.0;
      local_34 = 0;
      local_35 = 0;
      do {
        local_34 = local_34 * 2 + (uint)(0.5 <= local_10);
        local_35 = local_35 + 1;
        local_10 = (-(double)(0.5 <= local_10) * 0.5 + local_10) * 2.0;
        local_45 = local_35 < 0x20 && 0.0 < local_10;
      } while (local_45);
      *in_RDI = CONCAT44(local_34,CONCAT13(uStack_41,
                                           CONCAT12(local_35,CONCAT11((char)local_30 + '\x1f',
                                                                      in_XMM0_Qa < 0.0))));
      local_1 = true;
    }
  }
  else {
    *in_RDI = CONCAT44(1,(uint)bStack_25 << 0x18);
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool double_to_depth_representation_element(
    double v, DepthRepresentationElement *element) {
  const double orig = v;
  if (v == 0.0) {
    *element = { 0, 0, 0, 1 };
    return true;
  }
  const bool sign = v < 0.0;
  if (sign) {
    v = -v;
  }
  int exp = 0;
  if (v >= 1.0) {
    while (v >= 2.0) {
      ++exp;
      v /= 2;
    }
  } else {
    while (v < 1.0) {
      ++exp;
      v *= 2.0;
    }
    exp = -exp;
  }
  if ((exp + 31) <= 0 || (exp + 31) > 126) {
    fprintf(stderr,
            "Error: Floating point value %f out of range (too large or too "
            "small)\n",
            orig);
    return false;
  }
  assert(v >= 1.0 && v < 2.0);
  v -= 1.0;
  uint32_t mantissa = 0;
  uint8_t mantissa_len = 0;
  constexpr uint8_t kMaxMantissaLen = 32;
  do {
    const int bit = (v >= 0.5);
    mantissa = (mantissa << 1) + bit;
    v -= bit * 0.5;
    ++mantissa_len;
    v *= 2.0;
  } while (mantissa_len < kMaxMantissaLen && v > 0.0);
  *element = { sign, static_cast<uint8_t>(exp + 31), mantissa_len, mantissa };
  return true;
}